

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkLogicOp __thiscall
Diligent::LogicOperationToVkLogicOp::operator[](LogicOperationToVkLogicOp *this,LOGIC_OPERATION op)

{
  char (*in_RCX) [53];
  string msg;
  string local_38;
  
  if (LOGIC_OP_OR_INVERTED < op) {
    FormatString<char[26],char[53]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"op >= LOGIC_OP_CLEAR && op < LOGIC_OP_NUM_OPERATIONS",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x37b);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (this->m_Map)._M_elems[(char)op];
}

Assistant:

VkLogicOp operator[](LOGIC_OPERATION op) const
    {
        VERIFY_EXPR(op >= LOGIC_OP_CLEAR && op < LOGIC_OP_NUM_OPERATIONS);
        return m_Map[static_cast<int>(op)];
    }